

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O0

bool Process::daemonize(String *logFile)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  __pid_t _Var4;
  char *__file;
  pid_t childPid;
  int fd;
  String *logFile_local;
  
  __file = String::operator_cast_to_char_(logFile);
  iVar2 = ::open(__file,0x80041,0x180);
  if (iVar2 == -1) {
    logFile_local._7_1_ = false;
  }
  else {
    iVar3 = dup2(iVar2,1);
    if (iVar3 == -1) {
      iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x496,"dup2(fd, STDOUT_FILENO) != -1");
      if (iVar3 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    iVar3 = dup2(iVar2,2);
    if (iVar3 == -1) {
      iVar3 = Debug::printf("%s:%u: verification failed: %s\n",
                            "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                            ,0x497,"dup2(fd, STDERR_FILENO) != -1");
      if (iVar3 != 0) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
    ::close(iVar2);
    _Var4 = fork();
    if (_Var4 == -1) {
      logFile_local._7_1_ = false;
    }
    else if (_Var4 == 0) {
      _Var4 = setsid();
      if (_Var4 == -1) {
        iVar2 = Debug::printf("%s:%u: verification failed: %s\n",
                              "/workspace/llm4binary/github/license_c_cmakelists/craflin[P]libnstd/src/Process.cpp"
                              ,0x4a2,"setsid() != -1");
        if (iVar2 != 0) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
      }
      logFile_local._7_1_ = true;
    }
    else {
      exit(0);
      logFile_local._7_1_ = false;
    }
  }
  return logFile_local._7_1_;
}

Assistant:

bool Process::daemonize(const String& logFile)
{
  int fd = ::open(logFile, O_CREAT | O_WRONLY |  O_CLOEXEC, S_IRUSR | S_IWUSR);
  if(fd == -1)
    return false;
  VERIFY(dup2(fd, STDOUT_FILENO) != -1);
  VERIFY(dup2(fd, STDERR_FILENO) != -1);
  ::close(fd);

  pid_t childPid = fork();
  if(childPid == -1)
    return false;
  if(childPid != 0)
  {
    exit(0);
    return false;
  }
  VERIFY(setsid() != -1);
  return true;
}